

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O3

int __thiscall
CombinedH264Demuxer::simpleDemuxBlock
          (CombinedH264Demuxer *this,DemuxedData *demuxedData,PIDSet *acceptedPIDs,
          int64_t *discardSize)

{
  CombinedH264Reader *this_00;
  long lVar1;
  int iVar2;
  uint uVar3;
  ReadState RVar4;
  undefined4 extraout_var;
  ulong uVar5;
  uint8_t *puVar6;
  uint8_t *dataEnd;
  size_t sVar7;
  pointer __src;
  pointer puVar8;
  uint8_t *end;
  uint8_t *pos;
  bool isFirstBlock;
  uint32_t readedBytes;
  int readRez;
  uint local_48;
  int local_44;
  MemoryBlock *local_40;
  uint8_t *local_38;
  
  this_00 = &this->super_CombinedH264Reader;
  if ((this->super_CombinedH264Reader).m_firstDemuxCall == true) {
    CombinedH264Reader::fillPids(this_00,acceptedPIDs,0);
    (this->super_CombinedH264Reader).m_firstDemuxCall = false;
  }
  *discardSize = 0;
  local_44 = 0;
  iVar2 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,&local_48,&local_44);
  if (local_44 == 2) {
    this->m_lastReadRez = 2;
    iVar2 = 2;
  }
  else {
    sVar7 = (this->super_CombinedH264Reader).m_tmpBuffer.m_size;
    if ((sVar7 + local_48 == 0) || ((local_48 == 0 && (this->m_lastReadRez == 1)))) {
      this->m_lastReadRez = local_44;
      iVar2 = 1;
    }
    else {
      if (local_48 == 0) {
        uVar5 = 0;
      }
      else {
        (*this->m_bufferedReader->_vptr_AbstractReader[5])
                  (this->m_bufferedReader,(ulong)(uint)this->m_readerID,(ulong)local_48);
        uVar5 = (ulong)local_48;
        sVar7 = (this->super_CombinedH264Reader).m_tmpBuffer.m_size;
      }
      this->m_lastReadRez = local_44;
      lVar1 = CONCAT44(extraout_var,iVar2) + uVar5;
      end = (uint8_t *)(lVar1 + 0x80);
      pos = (uint8_t *)(CONCAT44(extraout_var,iVar2) + 0x80);
      if (sVar7 != 0) {
        pos = pos + -sVar7;
        puVar8 = (this->super_CombinedH264Reader).m_tmpBuffer.m_data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __src = (pointer)0x0;
        if (puVar8 != (this->super_CombinedH264Reader).m_tmpBuffer.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          __src = puVar8;
        }
        memcpy(pos,__src,sVar7);
        (this->super_CombinedH264Reader).m_tmpBuffer.m_size = 0;
      }
      local_40 = &(this->super_CombinedH264Reader).m_tmpBuffer;
      puVar6 = NALUnit::findNALWithStartCode(pos + 3,end,true);
      local_38 = (uint8_t *)(lVar1 + 0x7c);
      if (pos < local_38) {
        do {
          dataEnd = puVar6;
          uVar3 = CombinedH264Reader::getPrefixLen(pos,end);
          if (uVar3 == 0) {
            RVar4 = (this->super_CombinedH264Reader).m_state;
LAB_00180ccd:
            if (RVar4 == Primary) goto LAB_00180d05;
            if (RVar4 == Both) {
              CombinedH264Reader::addDataToPrimary(this_00,pos,dataEnd,demuxedData,discardSize);
            }
            CombinedH264Reader::addDataToSecondary(this_00,pos,dataEnd,demuxedData,discardSize);
          }
          else {
            RVar4 = CombinedH264Reader::detectStreamByNal(this_00,pos + uVar3,dataEnd);
            (this->super_CombinedH264Reader).m_state = RVar4;
            if (RVar4 != NeedMoreData) goto LAB_00180ccd;
            sVar7 = (long)end - (long)pos;
            if ((long)sVar7 < 0x80) {
              if (end == pos) {
                return 0;
              }
              MemoryBlock::grow(local_40,sVar7);
              puVar8 = (this->super_CombinedH264Reader).m_tmpBuffer.m_data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start +
                       ((this->super_CombinedH264Reader).m_tmpBuffer.m_size - sVar7);
              goto LAB_00180df1;
            }
            (this->super_CombinedH264Reader).m_state = Primary;
LAB_00180d05:
            CombinedH264Reader::addDataToPrimary(this_00,pos,dataEnd,demuxedData,discardSize);
          }
          puVar6 = NALUnit::findNALWithStartCode(dataEnd + 3,end,true);
          pos = dataEnd;
        } while (dataEnd < local_38);
      }
      iVar2 = 0;
      if (pos < end) {
        if (this->m_lastReadRez == 1) {
          iVar2 = 0;
          if ((this->super_CombinedH264Reader).m_state == Primary) {
            CombinedH264Reader::addDataToPrimary(this_00,pos,end,demuxedData,discardSize);
          }
          else {
            CombinedH264Reader::addDataToSecondary(this_00,pos,end,demuxedData,discardSize);
          }
        }
        else {
          sVar7 = (long)end - (long)pos;
          MemoryBlock::grow(local_40,sVar7);
          puVar8 = (this->super_CombinedH264Reader).m_tmpBuffer.m_data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   ((this->super_CombinedH264Reader).m_tmpBuffer.m_size - sVar7);
LAB_00180df1:
          iVar2 = 0;
          memcpy(puVar8,pos,sVar7);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int CombinedH264Demuxer::simpleDemuxBlock(DemuxedData& demuxedData, const PIDSet& acceptedPIDs, int64_t& discardSize)
{
    if (m_firstDemuxCall)
    {
        fillPids(acceptedPIDs, 0);
        m_firstDemuxCall = false;
    }

    discardSize = 0;

    uint32_t readedBytes;
    int readRez = 0;
    bool isFirstBlock = false;
    uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez, &isFirstBlock);  // blocked read mode
    if (readRez == BufferedFileReader::DATA_NOT_READY)
    {
        m_lastReadRez = readRez;
        return BufferedFileReader::DATA_NOT_READY;
    }

    if (readedBytes + m_tmpBuffer.size() == 0 || (readedBytes == 0 && m_lastReadRez == BufferedReader::DATA_EOF))
    {
        m_lastReadRez = readRez;
        return BufferedReader::DATA_EOF;
    }
    if (readedBytes > 0)
        m_bufferedReader->notify(m_readerID, readedBytes);
    m_lastReadRez = readRez;
    data += MAX_TMP_BUFFER_SIZE;
    uint8_t* dataEnd = data + readedBytes;
    if (m_tmpBuffer.size() > 0)
    {
        data -= m_tmpBuffer.size();
        memcpy(data, m_tmpBuffer.data(), m_tmpBuffer.size());
        m_tmpBuffer.clear();
    }
    uint8_t* curNal = data;

    uint8_t* nextNal = NALUnit::findNALWithStartCode(curNal + 3, dataEnd, true);
    while (curNal < dataEnd - 4)
    {
        const int prefixLen = getPrefixLen(curNal, dataEnd);
        if (prefixLen != 0)
        {
            m_state = detectStreamByNal(curNal + prefixLen, nextNal);
            if (m_state == ReadState::NeedMoreData)
            {
                if (dataEnd - curNal < MAX_TMP_BUFFER_SIZE)
                {
                    m_tmpBuffer.append(curNal, dataEnd - curNal);
                    return 0;
                }
                // some error in a stream, just ignore
                m_state = ReadState::Primary;
            }
        }
        if (m_state == ReadState::Both)
        {
            addDataToPrimary(curNal, nextNal, demuxedData, discardSize);
            addDataToSecondary(curNal, nextNal, demuxedData, discardSize);
        }
        else if (m_state == ReadState::Primary)
            addDataToPrimary(curNal, nextNal, demuxedData, discardSize);
        else
            addDataToSecondary(curNal, nextNal, demuxedData, discardSize);
        curNal = nextNal;
        nextNal = NALUnit::findNALWithStartCode(curNal + 3, dataEnd, true);
    }

    if (curNal < dataEnd)
    {
        if (m_lastReadRez == BufferedReader::DATA_EOF)
        {
            if (m_state == ReadState::Primary)
                addDataToPrimary(curNal, dataEnd, demuxedData, discardSize);
            else
                addDataToSecondary(curNal, dataEnd, demuxedData, discardSize);
        }
        else
        {
            m_tmpBuffer.append(curNal, dataEnd - curNal);
        }
    }

    return 0;
}